

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSequenceRepeatLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  allocator<char> local_89;
  string local_88;
  byte local_62;
  allocator<char> local_61;
  string local_60;
  byte local_3a;
  byte local_39;
  uint local_38;
  byte local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    local_21 = 1;
  }
  local_38 = (uint)!bVar2;
  if ((local_21 & 1) == 0) {
    Result::~Result(__return_storage_ptr__);
  }
  if (local_38 == 0) {
    local_39 = 0;
    validateOutputCount(__return_storage_ptr__,local_20,1,1);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      local_39 = 1;
    }
    local_38 = (uint)!bVar2;
    if ((local_39 & 1) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    pNVar1 = local_20;
    if (local_38 == 0) {
      if ((this->ndArrayInterpretation & 1U) != 0) {
        local_3a = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,"SequenceRepeat",&local_61);
        validateInputOutputRankEquality
                  (__return_storage_ptr__,pNVar1,&local_60,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator(&local_61);
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          local_3a = 1;
        }
        local_38 = (uint)!bVar2;
        if ((local_3a & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        pNVar1 = local_20;
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
        local_62 = 0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"SequenceRepeat",&local_89);
        validateRankCount(__return_storage_ptr__,pNVar1,&local_88,5,-1,&this->blobNameToRank);
        std::__cxx11::string::~string((string *)&local_88);
        std::allocator<char>::~allocator(&local_89);
        bVar2 = Result::good(__return_storage_ptr__);
        if (!bVar2) {
          local_62 = 1;
        }
        local_38 = (uint)!bVar2;
        if ((local_62 & 1) == 0) {
          Result::~Result(__return_storage_ptr__);
        }
        if (local_38 != 0) {
          return __return_storage_ptr__;
        }
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSequenceRepeatLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "SequenceRepeat", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "SequenceRepeat", 5, -1, blobNameToRank));
    }

    return Result();
}